

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

Texture * __thiscall nite::Texture::operator=(Texture *this,Texture *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture *local_20;
  
  if (-1 < other->objectId) {
    unload(this);
    this->scale = other->scale;
    fVar1 = (other->region).y;
    fVar2 = (other->region).w;
    fVar3 = (other->region).h;
    (this->region).x = (other->region).x;
    (this->region).y = fVar1;
    (this->region).w = fVar2;
    (this->region).h = fVar3;
    this->smooth = other->smooth;
    this->objectId = other->objectId;
    std::__cxx11::string::_M_assign((string *)this);
    local_20 = this;
    std::vector<nite::Texture*,std::allocator<nite::Texture*>>::emplace_back<nite::Texture*>
              ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)
               &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].owners,&local_20);
  }
  return this;
}

Assistant:

nite::Texture& nite::Texture::operator= (const nite::Texture &other){
	if(other.objectId <= -1) return *this;
	unload();
	scale = other.scale;
	region = other.region;
	smooth = other.smooth;
	objectId = other.objectId;
	filename = other.filename;
	textureList[objectId].owners.push_back(this);
	return *this;
}